

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_miniz.h
# Opt level: O1

tinfl_status
buminiz::tinfl_decompress
          (tinfl_decompressor *r,mz_uint8 *pIn_buf_next,size_t *pIn_buf_size,
          mz_uint8 *pOut_buf_start,mz_uint8 *pOut_buf_next,size_t *pOut_buf_size,
          mz_uint32 decomp_flags)

{
  uint *puVar1;
  short sVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  tinfl_huff_table *ptVar7;
  undefined1 auVar8 [16];
  char cVar9;
  uint uVar10;
  ulong uVar11;
  mz_uint8 *pmVar12;
  mz_uint8 *pmVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  mz_uint8 *pmVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  ushort uVar25;
  mz_uint8 *pmVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  char cVar38;
  ulong uVar39;
  mz_int16 *__s;
  size_t buf_len;
  mz_uint8 *pmVar40;
  bool bVar41;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM1 [16];
  undefined1 in_XMM2 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar61 [16];
  mz_uint total_syms [16];
  mz_uint next_code [17];
  tinfl_status local_15c;
  ulong local_158;
  ulong local_150;
  uint local_13c;
  ulong local_120;
  mz_uint8 *local_118;
  uint *local_110;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined8 local_78;
  int aiStack_70 [16];
  
  if (pOut_buf_next < pOut_buf_start) {
LAB_002131fe:
    *pOut_buf_size = 0;
    *pIn_buf_size = 0;
    return TINFL_STATUS_BAD_PARAM;
  }
  pmVar26 = pOut_buf_next + *pOut_buf_size;
  uVar18 = -(ulong)((decomp_flags & 4) != 0) | (ulong)(pmVar26 + ~(ulong)pOut_buf_start);
  if ((uVar18 + 1 & uVar18) != 0) goto LAB_002131fe;
  uVar15 = r->m_state;
  uVar20 = r->m_num_bits;
  local_120 = r->m_bit_buf;
  uVar16 = r->m_dist;
  local_150 = (ulong)uVar16;
  uVar33 = r->m_counter;
  uVar11 = (ulong)uVar33;
  local_13c = r->m_num_extra;
  local_158 = r->m_dist_from_out_buf_start;
  local_15c = TINFL_STATUS_FAILED;
  cVar9 = '\0';
  local_110 = (uint *)pIn_buf_next;
  local_118 = pOut_buf_next;
  if (0x35 < uVar15) {
LAB_002137a1:
    cVar38 = '\0';
    goto LAB_002139de;
  }
  sVar3 = *pIn_buf_size;
  puVar1 = (uint *)(pIn_buf_next + sVar3);
  switch(uVar15) {
  case 0:
    r->m_zhdr1 = 0;
    r->m_z_adler32 = 1;
    r->m_zhdr0 = 0;
    r->m_check_adler32 = 1;
    if ((decomp_flags & 1) != 0) {
      if ((long)sVar3 < 1) {
        local_120 = 0;
        local_13c = 0;
        uVar33 = 0;
        local_150 = 0;
        uVar20 = 0;
        goto LAB_00213881;
      }
      local_110 = (uint *)(pIn_buf_next + 1);
      r->m_zhdr0 = (uint)*pIn_buf_next;
      local_120 = 0;
      local_13c = 0;
      uVar33 = 0;
      local_150 = 0;
      uVar20 = 0;
      goto LAB_002138a1;
    }
    local_120 = 0;
    local_13c = 0;
    uVar11 = 0;
    local_150 = 0;
    uVar20 = 0;
joined_r0x00213cf9:
    do {
      for (; uVar20 < 3; uVar20 = uVar20 + 8) {
        if (local_110 < puVar1) {
LAB_002133d4:
          uVar27 = (ulong)(byte)*local_110;
          local_110 = (uint *)((long)local_110 + 1);
        }
        else {
LAB_00213ed4:
          uVar16 = (uint)local_150;
          uVar33 = (uint)uVar11;
          uVar27 = 0;
          uVar39 = 0;
          if ((decomp_flags & 2) != 0) {
            local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
            uVar15 = 3;
            cVar9 = '\x01';
            goto LAB_002139da;
          }
        }
        local_120 = local_120 | uVar27 << ((byte)uVar20 & 0x3f);
      }
      uVar33 = (uint)uVar11;
      uVar15 = (uint)local_120 & 7;
      r->m_final = uVar15;
      local_120 = local_120 >> 3;
      uVar20 = uVar20 - 3;
      uVar16 = uVar15 >> 1;
      r->m_type = uVar16;
      if (1 < uVar15) {
        if (uVar16 == 1) {
          r->m_table_sizes[0] = 0x120;
          r->m_table_sizes[1] = 0x20;
          r->m_tables[1].m_code_size[0] = '\x05';
          r->m_tables[1].m_code_size[1] = '\x05';
          r->m_tables[1].m_code_size[2] = '\x05';
          r->m_tables[1].m_code_size[3] = '\x05';
          r->m_tables[1].m_code_size[4] = '\x05';
          r->m_tables[1].m_code_size[5] = '\x05';
          r->m_tables[1].m_code_size[6] = '\x05';
          r->m_tables[1].m_code_size[7] = '\x05';
          ptVar7 = r->m_tables;
          ptVar7[1].m_code_size[8] = '\x05';
          ptVar7[1].m_code_size[9] = '\x05';
          ptVar7[1].m_code_size[10] = '\x05';
          ptVar7[1].m_code_size[0xb] = '\x05';
          ptVar7[1].m_code_size[0xc] = '\x05';
          ptVar7[1].m_code_size[0xd] = '\x05';
          ptVar7[1].m_code_size[0xe] = '\x05';
          ptVar7[1].m_code_size[0xf] = '\x05';
          ptVar7 = r->m_tables;
          ptVar7[1].m_code_size[0x10] = '\x05';
          ptVar7[1].m_code_size[0x11] = '\x05';
          ptVar7[1].m_code_size[0x12] = '\x05';
          ptVar7[1].m_code_size[0x13] = '\x05';
          ptVar7[1].m_code_size[0x14] = '\x05';
          ptVar7[1].m_code_size[0x15] = '\x05';
          ptVar7[1].m_code_size[0x16] = '\x05';
          ptVar7[1].m_code_size[0x17] = '\x05';
          ptVar7 = r->m_tables;
          ptVar7[1].m_code_size[0x18] = '\x05';
          ptVar7[1].m_code_size[0x19] = '\x05';
          ptVar7[1].m_code_size[0x1a] = '\x05';
          ptVar7[1].m_code_size[0x1b] = '\x05';
          ptVar7[1].m_code_size[0x1c] = '\x05';
          ptVar7[1].m_code_size[0x1d] = '\x05';
          ptVar7[1].m_code_size[0x1e] = '\x05';
          ptVar7[1].m_code_size[0x1f] = '\x05';
          memset(r->m_tables,8,0x90);
          r->m_tables[0].m_code_size[0x90] = '\t';
          r->m_tables[0].m_code_size[0x91] = '\t';
          r->m_tables[0].m_code_size[0x92] = '\t';
          r->m_tables[0].m_code_size[0x93] = '\t';
          r->m_tables[0].m_code_size[0x94] = '\t';
          r->m_tables[0].m_code_size[0x95] = '\t';
          r->m_tables[0].m_code_size[0x96] = '\t';
          r->m_tables[0].m_code_size[0x97] = '\t';
          r->m_tables[0].m_code_size[0x98] = '\t';
          r->m_tables[0].m_code_size[0x99] = '\t';
          r->m_tables[0].m_code_size[0x9a] = '\t';
          r->m_tables[0].m_code_size[0x9b] = '\t';
          r->m_tables[0].m_code_size[0x9c] = '\t';
          r->m_tables[0].m_code_size[0x9d] = '\t';
          r->m_tables[0].m_code_size[0x9e] = '\t';
          r->m_tables[0].m_code_size[0x9f] = '\t';
          r->m_tables[0].m_code_size[0xa0] = '\t';
          r->m_tables[0].m_code_size[0xa1] = '\t';
          r->m_tables[0].m_code_size[0xa2] = '\t';
          r->m_tables[0].m_code_size[0xa3] = '\t';
          r->m_tables[0].m_code_size[0xa4] = '\t';
          r->m_tables[0].m_code_size[0xa5] = '\t';
          r->m_tables[0].m_code_size[0xa6] = '\t';
          r->m_tables[0].m_code_size[0xa7] = '\t';
          r->m_tables[0].m_code_size[0xa8] = '\t';
          r->m_tables[0].m_code_size[0xa9] = '\t';
          r->m_tables[0].m_code_size[0xaa] = '\t';
          r->m_tables[0].m_code_size[0xab] = '\t';
          r->m_tables[0].m_code_size[0xac] = '\t';
          r->m_tables[0].m_code_size[0xad] = '\t';
          r->m_tables[0].m_code_size[0xae] = '\t';
          r->m_tables[0].m_code_size[0xaf] = '\t';
          r->m_tables[0].m_code_size[0xb0] = '\t';
          r->m_tables[0].m_code_size[0xb1] = '\t';
          r->m_tables[0].m_code_size[0xb2] = '\t';
          r->m_tables[0].m_code_size[0xb3] = '\t';
          r->m_tables[0].m_code_size[0xb4] = '\t';
          r->m_tables[0].m_code_size[0xb5] = '\t';
          r->m_tables[0].m_code_size[0xb6] = '\t';
          r->m_tables[0].m_code_size[0xb7] = '\t';
          r->m_tables[0].m_code_size[0xb8] = '\t';
          r->m_tables[0].m_code_size[0xb9] = '\t';
          r->m_tables[0].m_code_size[0xba] = '\t';
          r->m_tables[0].m_code_size[0xbb] = '\t';
          r->m_tables[0].m_code_size[0xbc] = '\t';
          r->m_tables[0].m_code_size[0xbd] = '\t';
          r->m_tables[0].m_code_size[0xbe] = '\t';
          r->m_tables[0].m_code_size[0xbf] = '\t';
          r->m_tables[0].m_code_size[0xc0] = '\t';
          r->m_tables[0].m_code_size[0xc1] = '\t';
          r->m_tables[0].m_code_size[0xc2] = '\t';
          r->m_tables[0].m_code_size[0xc3] = '\t';
          r->m_tables[0].m_code_size[0xc4] = '\t';
          r->m_tables[0].m_code_size[0xc5] = '\t';
          r->m_tables[0].m_code_size[0xc6] = '\t';
          r->m_tables[0].m_code_size[199] = '\t';
          r->m_tables[0].m_code_size[200] = '\t';
          r->m_tables[0].m_code_size[0xc9] = '\t';
          r->m_tables[0].m_code_size[0xca] = '\t';
          r->m_tables[0].m_code_size[0xcb] = '\t';
          r->m_tables[0].m_code_size[0xcc] = '\t';
          r->m_tables[0].m_code_size[0xcd] = '\t';
          r->m_tables[0].m_code_size[0xce] = '\t';
          r->m_tables[0].m_code_size[0xcf] = '\t';
          r->m_tables[0].m_code_size[0xd0] = '\t';
          r->m_tables[0].m_code_size[0xd1] = '\t';
          r->m_tables[0].m_code_size[0xd2] = '\t';
          r->m_tables[0].m_code_size[0xd3] = '\t';
          r->m_tables[0].m_code_size[0xd4] = '\t';
          r->m_tables[0].m_code_size[0xd5] = '\t';
          r->m_tables[0].m_code_size[0xd6] = '\t';
          r->m_tables[0].m_code_size[0xd7] = '\t';
          r->m_tables[0].m_code_size[0xd8] = '\t';
          r->m_tables[0].m_code_size[0xd9] = '\t';
          r->m_tables[0].m_code_size[0xda] = '\t';
          r->m_tables[0].m_code_size[0xdb] = '\t';
          r->m_tables[0].m_code_size[0xdc] = '\t';
          r->m_tables[0].m_code_size[0xdd] = '\t';
          r->m_tables[0].m_code_size[0xde] = '\t';
          r->m_tables[0].m_code_size[0xdf] = '\t';
          r->m_tables[0].m_code_size[0xe0] = '\t';
          r->m_tables[0].m_code_size[0xe1] = '\t';
          r->m_tables[0].m_code_size[0xe2] = '\t';
          r->m_tables[0].m_code_size[0xe3] = '\t';
          r->m_tables[0].m_code_size[0xe4] = '\t';
          r->m_tables[0].m_code_size[0xe5] = '\t';
          r->m_tables[0].m_code_size[0xe6] = '\t';
          r->m_tables[0].m_code_size[0xe7] = '\t';
          r->m_tables[0].m_code_size[0xe8] = '\t';
          r->m_tables[0].m_code_size[0xe9] = '\t';
          r->m_tables[0].m_code_size[0xea] = '\t';
          r->m_tables[0].m_code_size[0xeb] = '\t';
          r->m_tables[0].m_code_size[0xec] = '\t';
          r->m_tables[0].m_code_size[0xed] = '\t';
          r->m_tables[0].m_code_size[0xee] = '\t';
          r->m_tables[0].m_code_size[0xef] = '\t';
          r->m_tables[0].m_code_size[0xf0] = '\t';
          r->m_tables[0].m_code_size[0xf1] = '\t';
          r->m_tables[0].m_code_size[0xf2] = '\t';
          r->m_tables[0].m_code_size[0xf3] = '\t';
          r->m_tables[0].m_code_size[0xf4] = '\t';
          r->m_tables[0].m_code_size[0xf5] = '\t';
          r->m_tables[0].m_code_size[0xf6] = '\t';
          r->m_tables[0].m_code_size[0xf7] = '\t';
          r->m_tables[0].m_code_size[0xf8] = '\t';
          r->m_tables[0].m_code_size[0xf9] = '\t';
          r->m_tables[0].m_code_size[0xfa] = '\t';
          r->m_tables[0].m_code_size[0xfb] = '\t';
          r->m_tables[0].m_code_size[0xfc] = '\t';
          r->m_tables[0].m_code_size[0xfd] = '\t';
          r->m_tables[0].m_code_size[0xfe] = '\t';
          r->m_tables[0].m_code_size[0xff] = '\t';
          *(undefined1 (*) [16])(r->m_tables[0].m_code_size + 0x100) = _DAT_0031e820;
          r->m_tables[0].m_code_size[0x110] = '\a';
          r->m_tables[0].m_code_size[0x111] = '\a';
          r->m_tables[0].m_code_size[0x112] = '\a';
          r->m_tables[0].m_code_size[0x113] = '\a';
          r->m_tables[0].m_code_size[0x114] = '\a';
          r->m_tables[0].m_code_size[0x115] = '\a';
          r->m_tables[0].m_code_size[0x116] = '\a';
          r->m_tables[0].m_code_size[0x117] = '\a';
          r->m_tables[0].m_code_size[0x118] = '\b';
          r->m_tables[0].m_code_size[0x119] = '\b';
          r->m_tables[0].m_code_size[0x11a] = '\b';
          r->m_tables[0].m_code_size[0x11b] = '\b';
          r->m_tables[0].m_code_size[0x11c] = '\b';
          r->m_tables[0].m_code_size[0x11d] = '\b';
          r->m_tables[0].m_code_size[0x11e] = '\b';
          r->m_tables[0].m_code_size[0x11f] = '\b';
LAB_0021426f:
          while( true ) {
            uVar16 = (uint)local_150;
            uVar33 = (uint)uVar11;
            lVar34 = (long)(int)r->m_type;
            if (lVar34 < 0) break;
            local_88 = (undefined1  [16])0x0;
            local_98 = (undefined1  [16])0x0;
            local_a8 = (undefined1  [16])0x0;
            local_b8 = (undefined1  [16])0x0;
            __s = r->m_tables[lVar34].m_look_up;
            iVar21 = 0;
            memset(__s,0,0xc80);
            auVar8 = _DAT_0027d800;
            uVar15 = r->m_table_sizes[lVar34];
            if ((ulong)uVar15 != 0) {
              uVar39 = 0;
              do {
                *(int *)(local_b8 + (ulong)r->m_tables[lVar34].m_code_size[uVar39] * 4) =
                     *(int *)(local_b8 + (ulong)r->m_tables[lVar34].m_code_size[uVar39] * 4) + 1;
                uVar39 = uVar39 + 1;
              } while (uVar15 != uVar39);
            }
            local_78 = 0;
            lVar28 = 0;
            uVar15 = 0;
            do {
              uVar15 = uVar15 + *(int *)(local_b8 + lVar28 * 4 + 4);
              iVar21 = (iVar21 + *(int *)(local_b8 + lVar28 * 4 + 4)) * 2;
              aiStack_70[lVar28] = iVar21;
              lVar28 = lVar28 + 1;
            } while (lVar28 != 0xf);
            if (iVar21 != 0x10000 && 1 < uVar15) {
              uVar15 = 0x23;
LAB_00214a45:
              uVar39 = 0;
              cVar9 = '\0';
              goto LAB_002139da;
            }
            uVar15 = r->m_type;
            if (r->m_table_sizes[uVar15] != 0) {
              uVar16 = 0xffffffff;
              uVar39 = 0;
              auVar42 = pmovsxbq(extraout_XMM0,0x706);
              in_XMM1 = pmovsxbq(in_XMM1,0x504);
              in_XMM2 = pmovsxbq(in_XMM2,0x302);
              in_XMM3 = pmovsxbq(in_XMM3,0x100);
              do {
                bVar14 = r->m_tables[lVar34].m_code_size[uVar39];
                uVar27 = (ulong)bVar14;
                if (bVar14 != 0) {
                  uVar33 = *(uint *)((long)&local_78 + uVar27 * 4);
                  *(uint *)((long)&local_78 + uVar27 * 4) = uVar33 + 1;
                  uVar10 = (uint)bVar14;
                  uVar15 = 0;
                  do {
                    uVar19 = uVar15;
                    uVar24 = uVar33 & 1;
                    uVar15 = uVar24 + uVar19 * 2;
                    uVar33 = uVar33 >> 1;
                    uVar10 = uVar10 - 1;
                  } while (uVar10 != 0);
                  uVar19 = uVar19 * 2;
                  if (bVar14 < 0xb) {
                    if (uVar19 < 0x400) {
                      lVar28 = 1L << (bVar14 & 0x3f);
                      uVar25 = (ushort)uVar39 | (ushort)bVar14 << 9;
                      uVar19 = uVar19 | uVar24;
                      uVar15 = uVar19 + (int)lVar28;
                      uVar36 = (ulong)uVar15;
                      uVar35 = (ulong)(uVar15 < 0x400);
                      uVar27 = 0x400;
                      if (0x400 < uVar36) {
                        uVar27 = uVar36;
                      }
                      uVar36 = (uVar27 - uVar35) - uVar36 >> (bVar14 & 0x3f);
                      lVar37 = uVar35 + uVar36;
                      auVar43._8_4_ = (int)lVar37;
                      auVar43._0_8_ = lVar37;
                      auVar43._12_4_ = (int)((ulong)lVar37 >> 0x20);
                      auVar43 = auVar43 ^ auVar8;
                      uVar27 = 0;
                      do {
                        lVar37 = (uVar27 << (bVar14 & 0x3f)) + (ulong)uVar19;
                        auVar53._8_4_ = (int)uVar27;
                        auVar53._0_8_ = uVar27;
                        auVar53._12_4_ = (int)(uVar27 >> 0x20);
                        auVar45 = (auVar53 | in_XMM3) ^ auVar8;
                        iVar21 = auVar43._0_4_;
                        iVar30 = -(uint)(iVar21 < auVar45._0_4_);
                        iVar22 = auVar43._4_4_;
                        auVar46._4_4_ = -(uint)(iVar22 < auVar45._4_4_);
                        iVar23 = auVar43._8_4_;
                        iVar31 = -(uint)(iVar23 < auVar45._8_4_);
                        iVar29 = auVar43._12_4_;
                        auVar46._12_4_ = -(uint)(iVar29 < auVar45._12_4_);
                        auVar55._4_4_ = iVar30;
                        auVar55._0_4_ = iVar30;
                        auVar55._8_4_ = iVar31;
                        auVar55._12_4_ = iVar31;
                        auVar59 = pshuflw(in_XMM11,auVar55,0xe8);
                        auVar48._4_4_ = -(uint)(auVar45._4_4_ == iVar22);
                        auVar48._12_4_ = -(uint)(auVar45._12_4_ == iVar29);
                        auVar48._0_4_ = auVar48._4_4_;
                        auVar48._8_4_ = auVar48._12_4_;
                        auVar61 = pshuflw(in_XMM12,auVar48,0xe8);
                        auVar46._0_4_ = auVar46._4_4_;
                        auVar46._8_4_ = auVar46._12_4_;
                        auVar60 = pshuflw(auVar59,auVar46,0xe8);
                        auVar45._8_4_ = 0xffffffff;
                        auVar45._0_8_ = 0xffffffffffffffff;
                        auVar45._12_4_ = 0xffffffff;
                        auVar45 = (auVar60 | auVar61 & auVar59) ^ auVar45;
                        auVar45 = packssdw(auVar45,auVar45);
                        if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          __s[lVar37] = uVar25;
                        }
                        auVar46 = auVar48 & auVar55 | auVar46;
                        auVar45 = packssdw(auVar46,auVar46);
                        auVar60._8_4_ = 0xffffffff;
                        auVar60._0_8_ = 0xffffffffffffffff;
                        auVar60._12_4_ = 0xffffffff;
                        auVar45 = packssdw(auVar45 ^ auVar60,auVar45 ^ auVar60);
                        if ((auVar45 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                          __s[lVar28 + lVar37] = uVar25;
                        }
                        auVar45 = (auVar53 | in_XMM2) ^ auVar8;
                        iVar30 = -(uint)(iVar21 < auVar45._0_4_);
                        auVar58._4_4_ = -(uint)(iVar22 < auVar45._4_4_);
                        iVar31 = -(uint)(iVar23 < auVar45._8_4_);
                        auVar58._12_4_ = -(uint)(iVar29 < auVar45._12_4_);
                        auVar47._4_4_ = iVar30;
                        auVar47._0_4_ = iVar30;
                        auVar47._8_4_ = iVar31;
                        auVar47._12_4_ = iVar31;
                        auVar54._4_4_ = -(uint)(auVar45._4_4_ == iVar22);
                        auVar54._12_4_ = -(uint)(auVar45._12_4_ == iVar29);
                        auVar54._0_4_ = auVar54._4_4_;
                        auVar54._8_4_ = auVar54._12_4_;
                        auVar58._0_4_ = auVar58._4_4_;
                        auVar58._8_4_ = auVar58._12_4_;
                        auVar45 = auVar54 & auVar47 | auVar58;
                        auVar45 = packssdw(auVar45,auVar45);
                        auVar4._8_4_ = 0xffffffff;
                        auVar4._0_8_ = 0xffffffffffffffff;
                        auVar4._12_4_ = 0xffffffff;
                        auVar45 = packssdw(auVar45 ^ auVar4,auVar45 ^ auVar4);
                        if ((auVar45 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          __s[lVar28 * 2 + lVar37] = uVar25;
                        }
                        auVar48 = pshufhw(auVar47,auVar47,0x84);
                        auVar55 = pshufhw(auVar54,auVar54,0x84);
                        auVar46 = pshufhw(auVar48,auVar58,0x84);
                        auVar49._8_4_ = 0xffffffff;
                        auVar49._0_8_ = 0xffffffffffffffff;
                        auVar49._12_4_ = 0xffffffff;
                        auVar49 = (auVar46 | auVar55 & auVar48) ^ auVar49;
                        auVar48 = packssdw(auVar49,auVar49);
                        if ((auVar48 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          __s[(3L << (bVar14 & 0x3f)) + lVar37] = uVar25;
                        }
                        auVar48 = (auVar53 | in_XMM1) ^ auVar8;
                        iVar30 = -(uint)(iVar21 < auVar48._0_4_);
                        auVar51._4_4_ = -(uint)(iVar22 < auVar48._4_4_);
                        iVar31 = -(uint)(iVar23 < auVar48._8_4_);
                        auVar51._12_4_ = -(uint)(iVar29 < auVar48._12_4_);
                        auVar56._4_4_ = iVar30;
                        auVar56._0_4_ = iVar30;
                        auVar56._8_4_ = iVar31;
                        auVar56._12_4_ = iVar31;
                        auVar45 = pshuflw(auVar45,auVar56,0xe8);
                        auVar50._4_4_ = -(uint)(auVar48._4_4_ == iVar22);
                        auVar50._12_4_ = -(uint)(auVar48._12_4_ == iVar29);
                        auVar50._0_4_ = auVar50._4_4_;
                        auVar50._8_4_ = auVar50._12_4_;
                        in_XMM12 = pshuflw(auVar61 & auVar59,auVar50,0xe8);
                        in_XMM12 = in_XMM12 & auVar45;
                        auVar51._0_4_ = auVar51._4_4_;
                        auVar51._8_4_ = auVar51._12_4_;
                        auVar45 = pshuflw(auVar45,auVar51,0xe8);
                        auVar59._8_4_ = 0xffffffff;
                        auVar59._0_8_ = 0xffffffffffffffff;
                        auVar59._12_4_ = 0xffffffff;
                        auVar59 = (auVar45 | in_XMM12) ^ auVar59;
                        in_XMM11 = packssdw(auVar59,auVar59);
                        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          __s[lVar28 * 4 + lVar37] = uVar25;
                        }
                        auVar51 = auVar50 & auVar56 | auVar51;
                        auVar45 = packssdw(auVar51,auVar51);
                        auVar61._8_4_ = 0xffffffff;
                        auVar61._0_8_ = 0xffffffffffffffff;
                        auVar61._12_4_ = 0xffffffff;
                        auVar45 = packssdw(auVar45 ^ auVar61,auVar45 ^ auVar61);
                        if ((auVar45 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                          __s[(5L << (bVar14 & 0x3f)) + lVar37] = uVar25;
                        }
                        auVar45 = (auVar53 | auVar42) ^ auVar8;
                        iVar21 = -(uint)(iVar21 < auVar45._0_4_);
                        auVar57._4_4_ = -(uint)(iVar22 < auVar45._4_4_);
                        iVar23 = -(uint)(iVar23 < auVar45._8_4_);
                        auVar57._12_4_ = -(uint)(iVar29 < auVar45._12_4_);
                        auVar52._4_4_ = iVar21;
                        auVar52._0_4_ = iVar21;
                        auVar52._8_4_ = iVar23;
                        auVar52._12_4_ = iVar23;
                        auVar44._4_4_ = -(uint)(auVar45._4_4_ == iVar22);
                        auVar44._12_4_ = -(uint)(auVar45._12_4_ == iVar29);
                        auVar44._0_4_ = auVar44._4_4_;
                        auVar44._8_4_ = auVar44._12_4_;
                        auVar57._0_4_ = auVar57._4_4_;
                        auVar57._8_4_ = auVar57._12_4_;
                        auVar45 = auVar44 & auVar52 | auVar57;
                        auVar45 = packssdw(auVar45,auVar45);
                        auVar5._8_4_ = 0xffffffff;
                        auVar5._0_8_ = 0xffffffffffffffff;
                        auVar5._12_4_ = 0xffffffff;
                        auVar45 = packssdw(auVar45 ^ auVar5,auVar45 ^ auVar5);
                        if ((auVar45 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          __s[lVar37 + (6L << (bVar14 & 0x3f))] = uVar25;
                        }
                        auVar53 = pshufhw(auVar52,auVar52,0x84);
                        auVar45 = pshufhw(auVar44,auVar44,0x84);
                        auVar48 = pshufhw(auVar53,auVar57,0x84);
                        auVar6._8_4_ = 0xffffffff;
                        auVar6._0_8_ = 0xffffffffffffffff;
                        auVar6._12_4_ = 0xffffffff;
                        auVar45 = packssdw(auVar45 & auVar53,(auVar48 | auVar45 & auVar53) ^ auVar6)
                        ;
                        if ((auVar45 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          __s[lVar37 + (7L << (bVar14 & 0x3f))] = uVar25;
                        }
                        uVar27 = uVar27 + 8;
                      } while ((uVar35 + uVar36 + 8 & 0xfffffffffffffff8) != uVar27);
                    }
                  }
                  else {
                    uVar15 = uVar15 & 0x3ff;
                    uVar33 = (uint)__s[uVar15];
                    if (__s[uVar15] == 0) {
                      __s[uVar15] = (mz_int16)uVar16;
                      uVar33 = uVar16;
                      uVar16 = uVar16 - 2;
                    }
                    uVar19 = uVar19 >> 9;
                    if (bVar14 != 0xb) {
                      do {
                        iVar21 = ~uVar33 + (uint)((uVar19 >> 1 & 1) != 0);
                        sVar2 = r->m_tables[lVar34].m_tree[iVar21];
                        uVar33 = (uint)sVar2;
                        if (sVar2 == 0) {
                          r->m_tables[lVar34].m_tree[iVar21] = (mz_int16)uVar16;
                          uVar33 = uVar16;
                          uVar16 = uVar16 - 2;
                        }
                        uVar19 = uVar19 >> 1;
                        uVar15 = (int)uVar27 - 1;
                        uVar27 = (ulong)uVar15;
                      } while (0xb < uVar15);
                    }
                    r->m_tables[lVar34].m_tree[(int)(~uVar33 + (uint)((uVar19 >> 1 & 1) != 0))] =
                         (ushort)uVar39;
                  }
                }
                uVar39 = uVar39 + 1;
                uVar15 = r->m_type;
              } while (uVar39 < r->m_table_sizes[uVar15]);
            }
            uVar39 = 0;
            if (uVar15 == 2) {
              while( true ) {
                uVar11 = uVar39;
                uVar16 = (uint)local_150;
                uVar15 = r->m_table_sizes[0];
                uVar10 = r->m_table_sizes[1];
                uVar19 = uVar15 + uVar10;
                uVar33 = (uint)uVar11;
                if (uVar19 <= uVar33) break;
                if (uVar20 < 0xf) {
                  if ((long)puVar1 - (long)local_110 < 2) {
                    do {
                      uVar25 = r->m_tables[2].m_look_up[(uint)local_120 & 0x3ff];
                      uVar15 = (uint)(short)uVar25;
                      if ((short)uVar25 < 0) {
                        if (10 < uVar20) {
                          uVar16 = 0xc;
                          do {
                            sVar2 = r->m_tables[2].m_tree
                                    [(long)(int)~uVar15 +
                                     (ulong)((local_120 >> ((ulong)(uVar16 - 2) & 0x3f) & 1) != 0)];
                            uVar15 = (uint)sVar2;
                            if (-1 < sVar2) break;
                            bVar41 = uVar16 <= uVar20;
                            uVar16 = uVar16 + 1;
                          } while (bVar41);
                          if (-1 < sVar2) break;
                        }
                      }
                      else if ((0x1ff < uVar25) && (uVar15 >> 9 <= uVar20)) break;
                      if (local_110 < puVar1) {
LAB_00213507:
                        uVar27 = (ulong)(byte)*local_110;
                        local_110 = (uint *)((long)local_110 + 1);
                      }
                      else {
LAB_00213c06:
                        uVar16 = (uint)local_150;
                        uVar33 = (uint)uVar11;
                        uVar27 = 0;
                        uVar39 = 0;
                        if ((decomp_flags & 2) != 0) {
                          local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
                          uVar15 = 0x10;
                          cVar9 = '\x01';
                          goto LAB_002139da;
                        }
                      }
                      local_120 = local_120 | uVar27 << ((byte)uVar20 & 0x3f);
                      uVar20 = uVar20 + 8;
                    } while (uVar20 < 0xf);
                  }
                  else {
                    local_120 = local_120 |
                                (ulong)*(byte *)((long)local_110 + 1) << ((byte)uVar20 + 8 & 0x3f) |
                                (ulong)(byte)*local_110 << ((byte)uVar20 & 0x3f);
                    local_110 = (uint *)((long)local_110 + 2);
                    uVar20 = uVar20 | 0x10;
                  }
                }
                uVar15 = (uint)r->m_tables[2].m_look_up[(uint)local_120 & 0x3ff];
                local_150 = (ulong)uVar15;
                if ((int)uVar15 < 0) {
                  uVar39 = 10;
                  do {
                    uVar16 = (int)uVar39 + 1;
                    uVar15 = (uint)r->m_tables[2].m_tree
                                   [(long)(int)~(uint)local_150 +
                                    (ulong)((local_120 >> (uVar39 & 0x3f) & 1) != 0)];
                    local_150 = (ulong)uVar15;
                    uVar39 = (ulong)uVar16;
                  } while ((int)uVar15 < 0);
                }
                else {
                  uVar16 = uVar15 >> 9;
                  local_150 = (ulong)(uVar15 & 0x1ff);
                }
                local_120 = local_120 >> ((byte)uVar16 & 0x3f);
                uVar20 = uVar20 - uVar16;
                uVar15 = (uint)local_150;
                if (uVar15 < 0x10) {
                  r->m_len_codes[uVar11] = (mz_uint8)local_150;
                  uVar39 = (ulong)((int)uVar11 + 1);
                }
                else {
                  if ((uVar15 == 0x10) && ((int)uVar11 == 0)) {
                    uVar33 = 0;
                    local_150 = 0x10;
                    uVar15 = 0x11;
                    goto LAB_00213f0b;
                  }
                  local_13c = (uint)"\x02\x03\a"[uVar15 - 0x10];
                  for (; uVar33 = (uint)uVar11, uVar20 < local_13c; uVar20 = uVar20 + 8) {
                    if (local_110 < puVar1) {
LAB_002136c0:
                      uVar11 = (ulong)(byte)*local_110;
                      local_110 = (uint *)((long)local_110 + 1);
                    }
                    else {
LAB_00214d8b:
                      uVar16 = (uint)local_150;
                      uVar11 = 0;
                      uVar39 = 0;
                      if ((decomp_flags & 2) != 0) {
                        local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
                        uVar15 = 0x12;
                        cVar9 = '\x01';
                        goto LAB_002139da;
                      }
                    }
                    local_120 = local_120 | uVar11 << ((byte)uVar20 & 0x3f);
                    uVar11 = (ulong)uVar33;
                  }
                  uVar15 = (uint)local_120;
                  local_120 = local_120 >> ((byte)local_13c & 0x3f);
                  uVar20 = uVar20 - local_13c;
                  uVar15 = (int)"\x03\x03\v"[(int)local_150 - 0x10] +
                           (uVar15 & ~(-1 << ((byte)local_13c & 0x1f)));
                  bVar14 = 0;
                  if ((int)local_150 == 0x10) {
                    bVar14 = r->m_len_codes[uVar33 - 1];
                  }
                  memset(r->m_len_codes + uVar11,(uint)bVar14,(ulong)uVar15);
                  uVar39 = (ulong)(uVar33 + uVar15);
                }
              }
              if (uVar33 != uVar19) {
                uVar15 = 0x15;
                goto LAB_00214a45;
              }
              memcpy(r->m_tables,r->m_len_codes,(ulong)uVar15);
              memcpy(r->m_tables + 1,r->m_len_codes + uVar15,(ulong)uVar10);
            }
            r->m_type = r->m_type - 1;
          }
LAB_00214a59:
          do {
            bVar14 = (byte)uVar20;
            if ((3 < (long)puVar1 - (long)local_110) && (1 < (long)pmVar26 - (long)local_118))
            goto code_r0x00214a7b;
            if (uVar20 < 0xf) {
              if ((long)puVar1 - (long)local_110 < 2) {
                do {
                  uVar25 = r->m_tables[0].m_look_up[(uint)local_120 & 0x3ff];
                  uVar15 = (uint)(short)uVar25;
                  if ((short)uVar25 < 0) {
                    if (10 < uVar20) {
                      uVar16 = 0xc;
                      do {
                        sVar2 = r->m_tables[0].m_tree
                                [(long)(int)~uVar15 +
                                 (ulong)((local_120 >> ((ulong)(uVar16 - 2) & 0x3f) & 1) != 0)];
                        uVar15 = (uint)sVar2;
                        if (-1 < sVar2) break;
                        bVar41 = uVar16 <= uVar20;
                        uVar16 = uVar16 + 1;
                      } while (bVar41);
                      if (-1 < sVar2) break;
                    }
                  }
                  else if ((0x1ff < uVar25) && (uVar15 >> 9 <= uVar20)) break;
                  if (local_110 < puVar1) {
LAB_002132e9:
                    uVar27 = (ulong)(byte)*local_110;
                    local_110 = (uint *)((long)local_110 + 1);
                  }
                  else {
LAB_00214bf6:
                    uVar16 = (uint)local_150;
                    uVar33 = (uint)uVar11;
                    uVar27 = 0;
                    uVar39 = 0;
                    if ((decomp_flags & 2) != 0) {
                      local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
                      uVar15 = 0x17;
                      cVar9 = '\x01';
                      goto LAB_002139da;
                    }
                  }
                  local_120 = local_120 | uVar27 << ((byte)uVar20 & 0x3f);
                  uVar20 = uVar20 + 8;
                } while (uVar20 < 0xf);
              }
              else {
                local_120 = local_120 |
                            (ulong)*(byte *)((long)local_110 + 1) << (bVar14 + 8 & 0x3f) |
                            (ulong)(byte)*local_110 << (bVar14 & 0x3f);
                local_110 = (uint *)((long)local_110 + 2);
                uVar20 = uVar20 | 0x10;
              }
            }
            uVar15 = (uint)r->m_tables[0].m_look_up[(uint)local_120 & 0x3ff];
            uVar11 = (ulong)uVar15;
            if ((int)uVar15 < 0) {
              uVar39 = 10;
              do {
                uVar16 = (int)uVar39 + 1;
                uVar15 = (uint)r->m_tables[0].m_tree
                               [(long)(int)~(uint)uVar11 +
                                (ulong)((local_120 >> (uVar39 & 0x3f) & 1) != 0)];
                uVar11 = (ulong)uVar15;
                uVar39 = (ulong)uVar16;
              } while ((int)uVar15 < 0);
            }
            else {
              uVar16 = uVar15 >> 9;
              uVar11 = (ulong)(uVar15 & 0x1ff);
            }
            local_120 = local_120 >> ((byte)uVar16 & 0x3f);
            uVar20 = uVar20 - uVar16;
            uVar15 = (uint)uVar11;
            if (0xff < uVar15) goto LAB_00214c6f;
LAB_00214cb0:
            uVar33 = (uint)uVar11;
            if (pmVar26 <= local_118) {
              local_15c = TINFL_STATUS_HAS_MORE_OUTPUT;
              uVar11 = 1;
              uVar15 = 0x18;
              goto LAB_00213ec3;
            }
            *local_118 = (mz_uint8)uVar11;
            local_118 = local_118 + 1;
          } while( true );
        }
        uVar11 = 0;
        if (uVar16 != 3) {
          while (uVar15 = (uint)uVar11, uVar15 < 3) {
            if (uVar20 < (uint)(int)"\x05\x05\x04"[uVar11]) {
              do {
                if (local_110 < puVar1) {
LAB_00213398:
                  uVar27 = (ulong)(byte)*local_110;
                  local_110 = (uint *)((long)local_110 + 1);
                }
                else {
LAB_002141a1:
                  uVar16 = (uint)local_150;
                  uVar33 = (uint)uVar11;
                  uVar27 = 0;
                  uVar39 = 0;
                  if ((decomp_flags & 2) != 0) {
                    local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
                    uVar15 = 0xb;
                    cVar9 = '\x01';
                    goto LAB_002139da;
                  }
                }
                local_120 = local_120 | uVar27 << ((byte)uVar20 & 0x3f);
                uVar20 = uVar20 + 8;
                uVar15 = (uint)uVar11;
              } while (uVar20 < (uint)(int)"\x05\x05\x04"[uVar11]);
            }
            bVar14 = "\x05\x05\x04"[uVar15];
            uVar20 = uVar20 - (int)(char)bVar14;
            r->m_table_sizes[uVar15] =
                 ((uint)local_120 & ~(-1 << (bVar14 & 0x1f))) +
                 tinfl_decompress::s_min_table_sizes[uVar15];
            local_120 = local_120 >> (bVar14 & 0x3f);
            uVar11 = (ulong)(uVar15 + 1);
          }
          memset(r->m_tables + 2,0,0x120);
          for (uVar11 = 0; (uint)uVar11 < r->m_table_sizes[2]; uVar11 = (ulong)((int)uVar11 + 1)) {
            for (; uVar20 < 3; uVar20 = uVar20 + 8) {
              if (local_110 < puVar1) {
LAB_002132ad:
                uVar27 = (ulong)(byte)*local_110;
                local_110 = (uint *)((long)local_110 + 1);
              }
              else {
LAB_0021423c:
                uVar16 = (uint)local_150;
                uVar33 = (uint)uVar11;
                uVar27 = 0;
                uVar39 = 0;
                if ((decomp_flags & 2) != 0) {
                  local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
                  uVar15 = 0xe;
                  cVar9 = '\x01';
                  goto LAB_002139da;
                }
              }
              local_120 = local_120 | uVar27 << ((byte)uVar20 & 0x3f);
            }
            bVar14 = (byte)local_120;
            local_120 = local_120 >> 3;
            uVar20 = uVar20 - 3;
            r->m_tables[2].m_code_size["\x10\x11\x12"[uVar11]] = bVar14 & 7;
          }
          r->m_table_sizes[2] = 0x13;
          goto LAB_0021426f;
        }
        uVar15 = 10;
LAB_00213ec3:
        uVar16 = (uint)local_150;
        uVar39 = 0;
        cVar9 = (char)uVar11;
        goto LAB_002139da;
      }
LAB_00213d20:
      local_120 = local_120 >> ((byte)uVar20 & 7);
      uVar20 = uVar20 & 0xfffffff8;
      uVar11 = 0;
      while (uVar33 = (uint)uVar11, uVar33 < 4) {
        if (uVar20 == 0) {
          uVar20 = 0;
          if (local_110 < puVar1) {
            uVar15 = *local_110;
            local_110 = (uint *)((long)local_110 + 1);
            r->m_raw_header[uVar11] = (byte)uVar15;
            uVar20 = 0;
          }
          else {
LAB_00213e9b:
            uVar33 = (uint)uVar11;
            if ((decomp_flags & 2) != 0) {
              local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
              uVar11 = 1;
              uVar15 = 7;
              goto LAB_00213ec3;
            }
            r->m_raw_header[uVar11] = '\0';
          }
        }
        else {
          uVar15 = uVar20;
          if (uVar20 < 8) {
            do {
              if (local_110 < puVar1) {
LAB_00213325:
                uVar39 = (ulong)(byte)*local_110;
                local_110 = (uint *)((long)local_110 + 1);
              }
              else {
LAB_00213f18:
                uVar16 = (uint)local_150;
                uVar33 = (uint)uVar11;
                uVar39 = 0;
                if ((decomp_flags & 2) != 0) {
                  local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
                  uVar15 = 6;
                  cVar9 = '\x01';
                  goto LAB_002139da;
                }
              }
              local_120 = local_120 | uVar39 << ((byte)uVar20 & 0x3f);
              uVar15 = uVar20 + 8;
              bVar41 = 0xfffffff7 < uVar20;
              uVar20 = uVar15;
            } while (bVar41);
          }
          uVar33 = (uint)uVar11;
          r->m_raw_header[uVar11] = (mz_uint8)local_120;
          local_120 = local_120 >> 8;
          uVar20 = uVar15 - 8;
        }
LAB_00213eac:
        uVar11 = (ulong)(uVar33 + 1);
      }
      uVar25 = *(ushort *)r->m_raw_header;
      uVar11 = (ulong)uVar25;
      uVar33 = (uint)uVar25;
      if ((*(ushort *)(r->m_raw_header + 2) ^ uVar25) != 0xffff) {
        uVar15 = 0x27;
LAB_00213f0b:
        uVar11 = 0;
        goto LAB_00213ec3;
      }
      while ((uVar33 = (uint)uVar11, uVar33 != 0 && (uVar20 != 0))) {
        uVar15 = uVar20;
        if (uVar20 < 8) {
          do {
            if (local_110 < puVar1) {
LAB_00213738:
              uVar27 = (ulong)(byte)*local_110;
              local_110 = (uint *)((long)local_110 + 1);
            }
            else {
LAB_002140a9:
              uVar16 = (uint)local_150;
              uVar33 = (uint)uVar11;
              uVar27 = 0;
              uVar39 = 0;
              if ((decomp_flags & 2) != 0) {
                local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
                uVar15 = 0x33;
                cVar9 = '\x01';
                goto LAB_002139da;
              }
            }
            uVar33 = (uint)uVar11;
            local_120 = local_120 | uVar27 << ((byte)uVar20 & 0x3f);
            uVar15 = uVar20 + 8;
            bVar41 = 0xfffffff7 < uVar20;
            uVar20 = uVar15;
          } while (bVar41);
        }
        local_150 = local_120 & 0xff;
        local_120 = local_120 >> 8;
        uVar20 = uVar15 - 8;
LAB_00213f79:
        if (pmVar26 <= local_118) {
          local_15c = TINFL_STATUS_HAS_MORE_OUTPUT;
          uVar11 = 1;
          uVar15 = 0x34;
          goto LAB_00213ec3;
        }
        *local_118 = (mz_uint8)local_150;
        local_118 = local_118 + 1;
        uVar11 = (ulong)(uVar33 - 1);
      }
      while ((int)uVar11 != 0) {
LAB_00213fcb:
        uVar33 = (uint)uVar11;
        if (pmVar26 <= local_118) {
          local_15c = TINFL_STATUS_HAS_MORE_OUTPUT;
          uVar11 = 1;
          uVar15 = 9;
          goto LAB_00213ec3;
        }
LAB_00213fe2:
        uVar33 = (uint)uVar11;
        if (puVar1 <= local_110) {
          if ((decomp_flags & 2) == 0) {
            uVar15 = 0x28;
            goto LAB_00213f0b;
          }
          local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
          uVar11 = 1;
          uVar15 = 0x26;
          goto LAB_00213ec3;
        }
        uVar39 = (long)puVar1 - (long)local_110;
        if ((ulong)((long)pmVar26 - (long)local_118) < (ulong)((long)puVar1 - (long)local_110)) {
          uVar39 = (long)pmVar26 - (long)local_118;
        }
        if (uVar11 <= uVar39) {
          uVar39 = uVar11;
        }
        memcpy(local_118,local_110,uVar39);
        local_110 = (uint *)((long)local_110 + uVar39);
        local_118 = local_118 + uVar39;
        uVar11 = (ulong)(uVar33 - (int)uVar39);
      }
      uVar11 = 0;
LAB_00214c82:
      uVar16 = (uint)local_150;
      uVar33 = (uint)uVar11;
    } while ((r->m_final & 1) == 0);
    if ((decomp_flags & 1) != 0) goto LAB_00214d38;
    goto LAB_00214c98;
  case 1:
    if ((long)sVar3 < 1) {
LAB_00213881:
      uVar16 = (uint)local_150;
      if ((decomp_flags & 2) != 0) {
        uVar15 = 1;
        uVar39 = 0;
        local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
        cVar9 = '\x01';
        break;
      }
      r->m_zhdr0 = 0;
    }
    else {
      r->m_zhdr0 = (uint)*pIn_buf_next;
      local_110 = (uint *)(pIn_buf_next + 1);
    }
LAB_002138a1:
    if (puVar1 <= local_110) goto LAB_002138af;
LAB_00213359:
    uVar15 = (uint)(byte)*local_110;
    local_110 = (uint *)((long)local_110 + 1);
LAB_002138bf:
    uVar16 = (uint)local_150;
    uVar33 = r->m_zhdr0;
    bVar41 = (uVar33 & 0xf) != 8 || ((uVar15 & 0x20) != 0 || (uVar33 << 8 | uVar15) % 0x1f != 0);
    r->m_zhdr1 = uVar15;
    if ((decomp_flags & 4) == 0) {
      bVar14 = (byte)(uVar33 >> 4);
      bVar41 = bVar41 || (uVar18 + 1 >> (bVar14 + 8 & 0x3f) == 0 ||
                         0x8000 < (uint)(0x100 << (bVar14 & 0x1f)));
    }
    uVar11 = 0;
    if (!bVar41) goto joined_r0x00213cf9;
    uVar33 = 1;
    uVar15 = 0x24;
    uVar39 = 0;
    cVar9 = '\0';
    break;
  case 2:
    if (0 < (long)sVar3) goto LAB_00213359;
LAB_002138af:
    uVar16 = (uint)local_150;
    uVar15 = 0;
    uVar39 = 0;
    if ((decomp_flags & 2) == 0) goto LAB_002138bf;
    local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
    uVar15 = 2;
    cVar9 = '\x01';
    break;
  case 3:
    if ((long)sVar3 < 1) goto LAB_00213ed4;
    goto LAB_002133d4;
  default:
    goto LAB_002137a1;
  case 5:
    if (0 < (long)sVar3) {
      uVar11 = (ulong)*pIn_buf_next;
      local_110 = (uint *)(pIn_buf_next + 1);
LAB_002137fa:
      local_120 = local_120 | uVar11 << ((byte)uVar20 & 0x3f);
      uVar20 = uVar20 + 8;
      goto LAB_00213d20;
    }
    uVar11 = 0;
    if ((decomp_flags & 2) == 0) goto LAB_002137fa;
    uVar15 = 5;
LAB_002139cf:
    local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
    uVar39 = 0;
    cVar9 = '\x01';
    break;
  case 6:
    if ((long)sVar3 < 1) goto LAB_00213f18;
    goto LAB_00213325;
  case 7:
    if ((long)sVar3 < 1) goto LAB_00213e9b;
    local_110 = (uint *)(pIn_buf_next + 1);
    r->m_raw_header[uVar11] = *pIn_buf_next;
    goto LAB_00213eac;
  case 9:
    goto LAB_00213fcb;
  case 10:
  case 0x11:
  case 0x15:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x27:
  case 0x28:
    uVar39 = 0;
    cVar9 = '\0';
    break;
  case 0xb:
    if ((long)sVar3 < 1) goto LAB_002141a1;
    goto LAB_00213398;
  case 0xe:
    if ((long)sVar3 < 1) goto LAB_0021423c;
    goto LAB_002132ad;
  case 0x10:
    if ((long)sVar3 < 1) goto LAB_00213c06;
    goto LAB_00213507;
  case 0x12:
    if ((long)sVar3 < 1) goto LAB_00214d8b;
    goto LAB_002136c0;
  case 0x17:
    if ((long)sVar3 < 1) goto LAB_00214bf6;
    goto LAB_002132e9;
  case 0x18:
    goto LAB_00214cb0;
  case 0x19:
    if ((long)sVar3 < 1) goto LAB_00213cb6;
    goto LAB_00213684;
  case 0x1a:
    if ((long)sVar3 < 1) goto LAB_00214eb1;
    goto LAB_002135ee;
  case 0x1b:
    if ((long)sVar3 < 1) goto LAB_00214f72;
    goto LAB_002136fc;
  case 0x20:
    if ((long)sVar3 < 1) {
      uVar18 = 0;
      if ((decomp_flags & 2) != 0) {
        uVar15 = 0x20;
        goto LAB_002139cf;
      }
    }
    else {
      uVar18 = (ulong)*pIn_buf_next;
      local_110 = (uint *)(pIn_buf_next + 1);
    }
    local_120 = local_120 | uVar18 << ((byte)uVar20 & 0x3f);
    uVar20 = uVar20 + 8;
LAB_00214d38:
    local_120 = local_120 >> ((byte)uVar20 & 7);
    uVar11 = 0;
    uVar10 = uVar20 & 0xfffffff8;
    while( true ) {
      uVar16 = (uint)local_150;
      uVar33 = (uint)uVar11;
      uVar20 = uVar10;
      if (3 < uVar33) break;
      if (uVar10 == 0) {
        uVar20 = 0;
        if (local_110 < puVar1) {
          uVar15 = (uint)(byte)*local_110;
          local_110 = (uint *)((long)local_110 + 1);
          uVar20 = 0;
        }
        else {
LAB_00213c75:
          uVar16 = (uint)local_150;
          uVar39 = 0;
          uVar15 = 0;
          if ((decomp_flags & 2) != 0) {
            local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
            uVar15 = 0x2a;
            cVar9 = '\x01';
            goto LAB_002139da;
          }
        }
      }
      else {
        if (uVar10 < 8) {
          do {
            if (local_110 < puVar1) {
LAB_002135b2:
              uVar39 = (ulong)(byte)*local_110;
              local_110 = (uint *)((long)local_110 + 1);
            }
            else {
LAB_00215107:
              uVar16 = (uint)local_150;
              uVar33 = (uint)uVar11;
              uVar39 = 0;
              if ((decomp_flags & 2) != 0) {
                local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
                uVar15 = 0x29;
                cVar9 = '\x01';
                goto LAB_002139da;
              }
            }
            uVar33 = (uint)uVar11;
            local_120 = local_120 | uVar39 << ((byte)uVar20 & 0x3f);
            uVar10 = uVar20 + 8;
            bVar41 = 0xfffffff7 < uVar20;
            uVar20 = uVar10;
          } while (bVar41);
        }
        uVar15 = (uint)local_120 & 0xff;
        local_120 = local_120 >> 8;
        uVar20 = uVar10 - 8;
      }
LAB_00213c28:
      r->m_z_adler32 = r->m_z_adler32 << 8 | uVar15;
      uVar11 = (ulong)(uVar33 + 1);
      uVar10 = uVar20;
    }
LAB_00214c98:
    local_15c = TINFL_STATUS_DONE;
    uVar15 = 0x22;
    uVar39 = 1;
    cVar9 = '\x01';
    break;
  case 0x22:
    local_15c = TINFL_STATUS_DONE;
    cVar9 = '\x01';
    uVar39 = 1;
    break;
  case 0x26:
    goto LAB_00213fe2;
  case 0x29:
    if ((long)sVar3 < 1) goto LAB_00215107;
    goto LAB_002135b2;
  case 0x2a:
    if ((long)sVar3 < 1) goto LAB_00213c75;
    local_110 = (uint *)(pIn_buf_next + 1);
    uVar15 = (uint)*pIn_buf_next;
    goto LAB_00213c28;
  case 0x33:
    if ((long)sVar3 < 1) goto LAB_002140a9;
    goto LAB_00213738;
  case 0x34:
    goto LAB_00213f79;
  case 0x35:
    uVar39 = local_158;
    goto LAB_002150c0;
  }
LAB_002139da:
  cVar38 = (char)uVar39;
  r->m_state = uVar15;
LAB_002139de:
  r->m_num_bits = uVar20;
  r->m_bit_buf = local_120;
  r->m_dist = uVar16;
  r->m_counter = uVar33;
  r->m_num_extra = local_13c;
  r->m_dist_from_out_buf_start = local_158;
  *pIn_buf_size = (long)local_110 - (long)pIn_buf_next;
  uVar18 = (long)local_118 - (long)pOut_buf_next;
  *pOut_buf_size = uVar18;
  if (cVar9 == '\x01' && (decomp_flags & 8) != 0) {
    uVar20 = r->m_check_adler32 & 0xffff;
    uVar15 = r->m_check_adler32 >> 0x10;
    if (uVar18 != 0) {
      uVar11 = uVar18 % 0x15b0;
      do {
        uVar27 = 0;
        uVar39 = uVar27;
        if (7 < uVar11) {
          do {
            iVar29 = pOut_buf_next[uVar39] + uVar20;
            iVar21 = (uint)pOut_buf_next[uVar39 + 1] + iVar29;
            iVar30 = (uint)pOut_buf_next[uVar39 + 2] + iVar21;
            iVar22 = (uint)pOut_buf_next[uVar39 + 3] + iVar30;
            iVar31 = (uint)pOut_buf_next[uVar39 + 4] + iVar22;
            iVar23 = (uint)pOut_buf_next[uVar39 + 5] + iVar31;
            iVar32 = (uint)pOut_buf_next[uVar39 + 6] + iVar23;
            uVar20 = (uint)pOut_buf_next[uVar39 + 7] + iVar32;
            uVar15 = uVar15 + iVar29 + iVar21 + iVar30 + iVar22 + iVar31 + iVar23 + iVar32 + uVar20;
            uVar27 = uVar39 + 8;
            iVar21 = (int)uVar39;
            uVar39 = uVar27;
          } while (iVar21 + 0xfU < (uint)uVar11);
          pOut_buf_next = pOut_buf_next + uVar27;
        }
        lVar34 = uVar11 - uVar27;
        if (uVar27 <= uVar11 && lVar34 != 0) {
          lVar28 = 0;
          do {
            uVar20 = uVar20 + pOut_buf_next[lVar28];
            uVar15 = uVar15 + uVar20;
            lVar28 = lVar28 + 1;
          } while (lVar34 != lVar28);
          pOut_buf_next = pOut_buf_next + lVar34;
        }
        uVar20 = uVar20 % 0xfff1;
        uVar15 = uVar15 % 0xfff1;
        uVar18 = uVar18 - uVar11;
        uVar11 = 0x15b0;
      } while (uVar18 != 0);
    }
    uVar20 = uVar15 << 0x10 | uVar20;
    r->m_check_adler32 = uVar20;
    if ((cVar38 != '\0') && (local_15c = TINFL_STATUS_DONE, (decomp_flags & 1) != 0)) {
      local_15c = (uint)(uVar20 == r->m_z_adler32) * 2 + TINFL_STATUS_ADLER32_MISMATCH;
    }
  }
  return local_15c;
code_r0x00214a7b:
  if (uVar20 < 0x1e) {
    local_120 = local_120 | (ulong)*local_110 << (bVar14 & 0x3f);
    local_110 = local_110 + 1;
    uVar20 = uVar20 | 0x20;
  }
  uVar15 = (uint)r->m_tables[0].m_look_up[(uint)local_120 & 0x3ff];
  uVar11 = (ulong)uVar15;
  if ((int)uVar15 < 0) {
    uVar39 = 10;
    do {
      uVar15 = (int)uVar39 + 1;
      uVar16 = (uint)r->m_tables[0].m_tree
                     [(long)(int)~(uint)uVar11 + (ulong)((local_120 >> (uVar39 & 0x3f) & 1) != 0)];
      uVar11 = (ulong)uVar16;
      uVar39 = (ulong)uVar15;
    } while ((int)uVar16 < 0);
  }
  else {
    uVar15 = uVar15 >> 9;
  }
  local_120 = local_120 >> ((byte)uVar15 & 0x3f);
  uVar20 = uVar20 - uVar15;
  if (((uint)uVar11 >> 8 & 1) == 0) {
    sVar2 = r->m_tables[0].m_look_up[(uint)local_120 & 0x3ff];
    uVar15 = (uint)sVar2;
    if (sVar2 < 0) {
      uVar39 = 10;
      do {
        uVar16 = (int)uVar39 + 1;
        sVar2 = r->m_tables[0].m_tree
                [(long)(int)~uVar15 + (ulong)((local_120 >> (uVar39 & 0x3f) & 1) != 0)];
        uVar15 = (uint)sVar2;
        uVar39 = (ulong)uVar16;
      } while (sVar2 < 0);
    }
    else {
      uVar16 = uVar15 >> 9;
    }
    local_120 = local_120 >> ((byte)uVar16 & 0x3f);
    uVar20 = uVar20 - uVar16;
    *local_118 = (mz_uint8)uVar11;
    if ((uVar15 >> 8 & 1) == 0) {
      local_118[1] = (mz_uint8)uVar15;
      local_118 = local_118 + 2;
      bVar41 = true;
    }
    else {
      local_118 = local_118 + 1;
      bVar41 = false;
      uVar11 = (ulong)uVar15;
    }
  }
  else {
    bVar41 = false;
  }
  uVar15 = (uint)uVar11;
  if (!bVar41) {
LAB_00214c6f:
    uVar11 = 0x100;
    if ((uVar15 & 0x1ff) != 0x100) {
      uVar39 = (ulong)((uVar15 & 0x1ff) - 0x101);
      uVar11 = (ulong)(uint)tinfl_decompress::s_length_base[uVar39];
      local_13c = 0;
      if (0xffffffffffffffeb < uVar39 - 0x1c) {
        local_13c = tinfl_decompress::s_length_extra[uVar39];
        uVar39 = local_120;
        for (; uVar20 < local_13c; uVar20 = uVar20 + 8) {
          local_120 = uVar39;
          if (local_110 < puVar1) {
LAB_00213684:
            uVar27 = (ulong)(byte)*local_110;
            local_110 = (uint *)((long)local_110 + 1);
          }
          else {
LAB_00213cb6:
            uVar16 = (uint)local_150;
            uVar33 = (uint)uVar11;
            uVar27 = 0;
            uVar39 = 0;
            if ((decomp_flags & 2) != 0) {
              local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
              uVar15 = 0x19;
              cVar9 = '\x01';
              goto LAB_002139da;
            }
          }
          uVar39 = local_120 | uVar27 << ((byte)uVar20 & 0x3f);
        }
        local_120 = uVar39 >> ((byte)local_13c & 0x3f);
        uVar20 = uVar20 - local_13c;
        uVar11 = (ulong)(((uint)uVar39 & ~(-1 << ((byte)local_13c & 0x1f))) + (int)uVar11);
      }
      if (uVar20 < 0xf) {
        if ((long)puVar1 - (long)local_110 < 2) {
          do {
            uVar25 = r->m_tables[1].m_look_up[(uint)local_120 & 0x3ff];
            uVar15 = (uint)(short)uVar25;
            if ((short)uVar25 < 0) {
              if (10 < uVar20) {
                uVar16 = 0xc;
                do {
                  sVar2 = r->m_tables[1].m_tree
                          [(long)(int)~uVar15 +
                           (ulong)((local_120 >> ((ulong)(uVar16 - 2) & 0x3f) & 1) != 0)];
                  uVar15 = (uint)sVar2;
                  if (-1 < sVar2) break;
                  bVar41 = uVar16 <= uVar20;
                  uVar16 = uVar16 + 1;
                } while (bVar41);
                if (-1 < sVar2) break;
              }
            }
            else if ((0x1ff < uVar25) && (uVar15 >> 9 <= uVar20)) break;
            if (local_110 < puVar1) {
LAB_002135ee:
              uVar27 = (ulong)(byte)*local_110;
              local_110 = (uint *)((long)local_110 + 1);
            }
            else {
LAB_00214eb1:
              uVar16 = (uint)local_150;
              uVar33 = (uint)uVar11;
              uVar27 = 0;
              uVar39 = 0;
              if ((decomp_flags & 2) != 0) {
                local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
                uVar15 = 0x1a;
                cVar9 = '\x01';
                goto LAB_002139da;
              }
            }
            local_120 = local_120 | uVar27 << ((byte)uVar20 & 0x3f);
            uVar20 = uVar20 + 8;
          } while (uVar20 < 0xf);
        }
        else {
          local_120 = local_120 |
                      (ulong)*(byte *)((long)local_110 + 1) << ((byte)uVar20 + 8 & 0x3f) |
                      (ulong)(byte)*local_110 << ((byte)uVar20 & 0x3f);
          local_110 = (uint *)((long)local_110 + 2);
          uVar20 = uVar20 | 0x10;
        }
      }
      sVar2 = r->m_tables[1].m_look_up[(uint)local_120 & 0x3ff];
      uVar15 = (uint)sVar2;
      if (sVar2 < 0) {
        uVar39 = 10;
        do {
          uVar16 = (int)uVar39 + 1;
          sVar2 = r->m_tables[1].m_tree
                  [(long)(int)~uVar15 + (ulong)((local_120 >> (uVar39 & 0x3f) & 1) != 0)];
          uVar15 = (uint)sVar2;
          uVar39 = (ulong)uVar16;
        } while (sVar2 < 0);
      }
      else {
        uVar16 = uVar15 >> 9;
        uVar15 = uVar15 & 0x1ff;
      }
      local_120 = local_120 >> ((byte)uVar16 & 0x3f);
      uVar20 = uVar20 - uVar16;
      uVar39 = (ulong)uVar15;
      local_150 = (ulong)(uint)tinfl_decompress::s_dist_base[uVar39];
      local_13c = 0;
      if (0xffffffffffffffe5 < uVar39 - 0x1e) {
        local_13c = tinfl_decompress::s_dist_extra[uVar39];
        uVar39 = local_120;
        for (; uVar20 < local_13c; uVar20 = uVar20 + 8) {
          local_120 = uVar39;
          if (local_110 < puVar1) {
LAB_002136fc:
            uVar27 = (ulong)(byte)*local_110;
            local_110 = (uint *)((long)local_110 + 1);
          }
          else {
LAB_00214f72:
            uVar16 = (uint)local_150;
            uVar33 = (uint)uVar11;
            uVar27 = 0;
            uVar39 = 0;
            if ((decomp_flags & 2) != 0) {
              local_15c = TINFL_STATUS_NEEDS_MORE_INPUT;
              uVar15 = 0x1b;
              cVar9 = '\x01';
              goto LAB_002139da;
            }
          }
          uVar39 = local_120 | uVar27 << ((byte)uVar20 & 0x3f);
        }
        local_120 = uVar39 >> ((byte)local_13c & 0x3f);
        uVar20 = uVar20 - local_13c;
        local_150 = (ulong)(((uint)uVar39 & ~(-1 << ((byte)local_13c & 0x1f))) + (int)local_150);
      }
      uVar33 = (uint)uVar11;
      local_158 = (long)local_118 - (long)pOut_buf_start;
      if (((decomp_flags & 4) != 0) && (local_158 < local_150)) {
        uVar11 = 0;
        uVar15 = 0x25;
        goto LAB_00213ec3;
      }
      pmVar12 = pOut_buf_start + (local_158 - local_150 & uVar18);
      pmVar17 = pmVar12;
      if (pmVar12 < local_118) {
        pmVar17 = local_118;
      }
      if (pmVar17 + uVar11 <= pmVar26) {
        if ((8 < uVar33) && (uVar33 <= (uint)local_150)) {
          pmVar17 = pmVar12 + (uVar33 & 0xfffffff8);
          do {
            pmVar40 = local_118;
            pmVar13 = pmVar12;
            *(undefined4 *)pmVar40 = *(undefined4 *)pmVar13;
            *(undefined4 *)(pmVar40 + 4) = *(undefined4 *)(pmVar13 + 4);
            local_118 = pmVar40 + 8;
            pmVar12 = pmVar13 + 8;
          } while (pmVar12 < pmVar17);
          uVar33 = uVar33 & 7;
          uVar11 = (ulong)uVar33;
          if (0xfffffffd < uVar33 - 3) {
            *local_118 = *pmVar12;
            if (uVar33 == 2) {
              pmVar40[9] = pmVar13[9];
            }
            local_118 = local_118 + uVar33;
          }
          if (uVar33 < 3) goto LAB_00214a59;
        }
        uVar11 = (ulong)(uVar33 - 3) + 3;
        do {
          pmVar13 = local_118;
          pmVar17 = pmVar12;
          *pmVar13 = *pmVar17;
          pmVar13[1] = pmVar17[1];
          pmVar13[2] = pmVar17[2];
          local_118 = pmVar13 + 3;
          uVar11 = uVar11 - 3;
          iVar21 = (int)uVar11;
          pmVar12 = pmVar17 + 3;
        } while (2 < iVar21);
        if (0 < iVar21) {
          *local_118 = pmVar17[3];
          if (iVar21 == 2) {
            pmVar13[4] = pmVar17[4];
          }
          local_118 = local_118 + uVar11;
        }
        goto LAB_00214a59;
      }
      while (iVar21 = (int)uVar11, uVar11 = (ulong)(iVar21 - 1), uVar39 = local_158, iVar21 != 0) {
LAB_002150c0:
        uVar33 = (uint)uVar11;
        if (pmVar26 <= local_118) {
          local_15c = TINFL_STATUS_HAS_MORE_OUTPUT;
          uVar11 = 1;
          uVar15 = 0x35;
          local_158 = uVar39;
          goto LAB_00213ec3;
        }
        local_158 = uVar39 + 1;
        *local_118 = pOut_buf_start[uVar39 - local_150 & uVar18];
        local_118 = local_118 + 1;
      }
      goto LAB_00214a59;
    }
    goto LAB_00214c82;
  }
  goto LAB_00214a59;
}

Assistant:

tinfl_status tinfl_decompress(tinfl_decompressor *r, const mz_uint8 *pIn_buf_next, size_t *pIn_buf_size, mz_uint8 *pOut_buf_start, mz_uint8 *pOut_buf_next, size_t *pOut_buf_size, const mz_uint32 decomp_flags)
{
  static const int s_length_base[31] = { 3,4,5,6,7,8,9,10,11,13, 15,17,19,23,27,31,35,43,51,59, 67,83,99,115,131,163,195,227,258,0,0 };
  static const int s_length_extra[31]= { 0,0,0,0,0,0,0,0,1,1,1,1,2,2,2,2,3,3,3,3,4,4,4,4,5,5,5,5,0,0,0 };
  static const int s_dist_base[32] = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193, 257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577,0,0};
  static const int s_dist_extra[32] = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13};
  static const mz_uint8 s_length_dezigzag[19] = { 16,17,18,0,8,7,9,6,10,5,11,4,12,3,13,2,14,1,15 };
  static const int s_min_table_sizes[3] = { 257, 1, 4 };

  tinfl_status status = TINFL_STATUS_FAILED; mz_uint32 num_bits, dist, counter, num_extra; tinfl_bit_buf_t bit_buf;
  const mz_uint8 *pIn_buf_cur = pIn_buf_next, *const pIn_buf_end = pIn_buf_next + *pIn_buf_size;
  mz_uint8 *pOut_buf_cur = pOut_buf_next, *const pOut_buf_end = pOut_buf_next + *pOut_buf_size;
  size_t out_buf_size_mask = (decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF) ? (size_t)-1 : ((pOut_buf_next - pOut_buf_start) + *pOut_buf_size) - 1, dist_from_out_buf_start;

  // Ensure the output buffer's size is a power of 2, unless the output buffer is large enough to hold the entire output file (in which case it doesn't matter).
  if (((out_buf_size_mask + 1) & out_buf_size_mask) || (pOut_buf_next < pOut_buf_start)) { *pIn_buf_size = *pOut_buf_size = 0; return TINFL_STATUS_BAD_PARAM; }

  num_bits = r->m_num_bits; bit_buf = r->m_bit_buf; dist = r->m_dist; counter = r->m_counter; num_extra = r->m_num_extra; dist_from_out_buf_start = r->m_dist_from_out_buf_start;
  TINFL_CR_BEGIN

  bit_buf = num_bits = dist = counter = num_extra = r->m_zhdr0 = r->m_zhdr1 = 0; r->m_z_adler32 = r->m_check_adler32 = 1;
  if (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER)
  {
    TINFL_GET_BYTE(1, r->m_zhdr0); TINFL_GET_BYTE(2, r->m_zhdr1);
    counter = (((r->m_zhdr0 * 256 + r->m_zhdr1) % 31 != 0) || (r->m_zhdr1 & 32) || ((r->m_zhdr0 & 15) != 8));
    if (!(decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF)) counter |= (((1U << (8U + (r->m_zhdr0 >> 4))) > 32768U) || ((out_buf_size_mask + 1) < (size_t)(1ULL << (8U + (r->m_zhdr0 >> 4)))));
    if (counter) { TINFL_CR_RETURN_FOREVER(36, TINFL_STATUS_FAILED); }
  }

  do
  {
    TINFL_GET_BITS(3, r->m_final, 3); r->m_type = r->m_final >> 1;
    if (r->m_type == 0)
    {
      TINFL_SKIP_BITS(5, num_bits & 7);
      for (counter = 0; counter < 4; ++counter) { if (num_bits) TINFL_GET_BITS(6, r->m_raw_header[counter], 8); else TINFL_GET_BYTE(7, r->m_raw_header[counter]); }
      if ((counter = (r->m_raw_header[0] | (r->m_raw_header[1] << 8))) != (mz_uint)(0xFFFF ^ (r->m_raw_header[2] | (r->m_raw_header[3] << 8)))) { TINFL_CR_RETURN_FOREVER(39, TINFL_STATUS_FAILED); }
      while ((counter) && (num_bits))
      {
        TINFL_GET_BITS(51, dist, 8);
        while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(52, TINFL_STATUS_HAS_MORE_OUTPUT); }
        *pOut_buf_cur++ = (mz_uint8)dist;
        counter--;
      }
      while (counter)
      {
        size_t n; while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(9, TINFL_STATUS_HAS_MORE_OUTPUT); }
        while (pIn_buf_cur >= pIn_buf_end)
        {
          if (decomp_flags & TINFL_FLAG_HAS_MORE_INPUT)
          {
            TINFL_CR_RETURN(38, TINFL_STATUS_NEEDS_MORE_INPUT);
          }
          else
          {
            TINFL_CR_RETURN_FOREVER(40, TINFL_STATUS_FAILED);
          }
        }
        n = MZ_MIN(MZ_MIN((size_t)(pOut_buf_end - pOut_buf_cur), (size_t)(pIn_buf_end - pIn_buf_cur)), counter);
        TINFL_MEMCPY(pOut_buf_cur, pIn_buf_cur, n); pIn_buf_cur += n; pOut_buf_cur += n; counter -= (mz_uint)n;
      }
    }
    else if (r->m_type == 3)
    {
      TINFL_CR_RETURN_FOREVER(10, TINFL_STATUS_FAILED);
    }
    else
    {
      if (r->m_type == 1)
      {
        mz_uint8 *p = r->m_tables[0].m_code_size; mz_uint i;
        r->m_table_sizes[0] = 288; r->m_table_sizes[1] = 32; TINFL_MEMSET(r->m_tables[1].m_code_size, 5, 32);
        for ( i = 0; i <= 143; ++i) *p++ = 8;
        for ( ; i <= 255; ++i) *p++ = 9;
        for ( ; i <= 279; ++i) *p++ = 7;
        for ( ; i <= 287; ++i) *p++ = 8;
      }
      else
      {
        for (counter = 0; counter < 3; counter++) { TINFL_GET_BITS(11, r->m_table_sizes[counter], "\05\05\04"[counter]); r->m_table_sizes[counter] += s_min_table_sizes[counter]; }
        MZ_CLEAR_OBJ(r->m_tables[2].m_code_size); for (counter = 0; counter < r->m_table_sizes[2]; counter++) { mz_uint s; TINFL_GET_BITS(14, s, 3); r->m_tables[2].m_code_size[s_length_dezigzag[counter]] = (mz_uint8)s; }
        r->m_table_sizes[2] = 19;
      }
      for ( ; (int)r->m_type >= 0; r->m_type--)
      {
        int tree_next, tree_cur; tinfl_huff_table *pTable;
        mz_uint i, j, used_syms, total, sym_index, next_code[17], total_syms[16]; pTable = &r->m_tables[r->m_type]; MZ_CLEAR_OBJ(total_syms); MZ_CLEAR_OBJ(pTable->m_look_up); MZ_CLEAR_OBJ(pTable->m_tree);
        for (i = 0; i < r->m_table_sizes[r->m_type]; ++i) total_syms[pTable->m_code_size[i]]++;
        used_syms = 0, total = 0; next_code[0] = next_code[1] = 0;
        for (i = 1; i <= 15; ++i) { used_syms += total_syms[i]; next_code[i + 1] = (total = ((total + total_syms[i]) << 1)); }
        if ((65536 != total) && (used_syms > 1))
        {
          TINFL_CR_RETURN_FOREVER(35, TINFL_STATUS_FAILED);
        }
        for (tree_next = -1, sym_index = 0; sym_index < r->m_table_sizes[r->m_type]; ++sym_index)
        {
          mz_uint rev_code = 0, l, cur_code, code_size = pTable->m_code_size[sym_index]; if (!code_size) continue;
          cur_code = next_code[code_size]++; for (l = code_size; l > 0; l--, cur_code >>= 1) rev_code = (rev_code << 1) | (cur_code & 1);
          if (code_size <= TINFL_FAST_LOOKUP_BITS) { mz_int16 k = (mz_int16)((code_size << 9) | sym_index); while (rev_code < TINFL_FAST_LOOKUP_SIZE) { pTable->m_look_up[rev_code] = k; rev_code += (1 << code_size); } continue; }
          if (0 == (tree_cur = pTable->m_look_up[rev_code & (TINFL_FAST_LOOKUP_SIZE - 1)])) { pTable->m_look_up[rev_code & (TINFL_FAST_LOOKUP_SIZE - 1)] = (mz_int16)tree_next; tree_cur = tree_next; tree_next -= 2; }
          rev_code >>= (TINFL_FAST_LOOKUP_BITS - 1);
          for (j = code_size; j > (TINFL_FAST_LOOKUP_BITS + 1); j--)
          {
            tree_cur -= ((rev_code >>= 1) & 1);
            if (!pTable->m_tree[-tree_cur - 1]) { pTable->m_tree[-tree_cur - 1] = (mz_int16)tree_next; tree_cur = tree_next; tree_next -= 2; } else tree_cur = pTable->m_tree[-tree_cur - 1];
          }
          tree_cur -= ((rev_code >>= 1) & 1); pTable->m_tree[-tree_cur - 1] = (mz_int16)sym_index;
        }
        if (r->m_type == 2)
        {
          for (counter = 0; counter < (r->m_table_sizes[0] + r->m_table_sizes[1]); )
          {
            mz_uint s; TINFL_HUFF_DECODE(16, dist, &r->m_tables[2]); if (dist < 16) { r->m_len_codes[counter++] = (mz_uint8)dist; continue; }
            if ((dist == 16) && (!counter))
            {
              TINFL_CR_RETURN_FOREVER(17, TINFL_STATUS_FAILED);
            }
            num_extra = "\02\03\07"[dist - 16]; TINFL_GET_BITS(18, s, num_extra); s += "\03\03\013"[dist - 16];
            TINFL_MEMSET(r->m_len_codes + counter, (dist == 16) ? r->m_len_codes[counter - 1] : 0, s); counter += s;
          }
          if ((r->m_table_sizes[0] + r->m_table_sizes[1]) != counter)
          {
            TINFL_CR_RETURN_FOREVER(21, TINFL_STATUS_FAILED);
          }
          TINFL_MEMCPY(r->m_tables[0].m_code_size, r->m_len_codes, r->m_table_sizes[0]); TINFL_MEMCPY(r->m_tables[1].m_code_size, r->m_len_codes + r->m_table_sizes[0], r->m_table_sizes[1]);
        }
      }
      for ( ; ; )
      {
        mz_uint8 *pSrc;
        for ( ; ; )
        {
          if (((pIn_buf_end - pIn_buf_cur) < 4) || ((pOut_buf_end - pOut_buf_cur) < 2))
          {
            TINFL_HUFF_DECODE(23, counter, &r->m_tables[0]);
            if (counter >= 256)
              break;
            while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(24, TINFL_STATUS_HAS_MORE_OUTPUT); }
            *pOut_buf_cur++ = (mz_uint8)counter;
          }
          else
          {
            int sym2; mz_uint code_len;
#if TINFL_USE_64BIT_BITBUF
            if (num_bits < 30) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE32(pIn_buf_cur)) << num_bits); pIn_buf_cur += 4; num_bits += 32; }
#else
            if (num_bits < 15) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE16(pIn_buf_cur)) << num_bits); pIn_buf_cur += 2; num_bits += 16; }
#endif
            if ((sym2 = r->m_tables[0].m_look_up[bit_buf & (TINFL_FAST_LOOKUP_SIZE - 1)]) >= 0)
              code_len = sym2 >> 9;
            else
            {
              code_len = TINFL_FAST_LOOKUP_BITS; do { sym2 = r->m_tables[0].m_tree[~sym2 + ((bit_buf >> code_len++) & 1)]; } while (sym2 < 0);
            }
            counter = sym2; bit_buf >>= code_len; num_bits -= code_len;
            if (counter & 256)
              break;

#if !TINFL_USE_64BIT_BITBUF
            if (num_bits < 15) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE16(pIn_buf_cur)) << num_bits); pIn_buf_cur += 2; num_bits += 16; }
#endif
            if ((sym2 = r->m_tables[0].m_look_up[bit_buf & (TINFL_FAST_LOOKUP_SIZE - 1)]) >= 0)
              code_len = sym2 >> 9;
            else
            {
              code_len = TINFL_FAST_LOOKUP_BITS; do { sym2 = r->m_tables[0].m_tree[~sym2 + ((bit_buf >> code_len++) & 1)]; } while (sym2 < 0);
            }
            bit_buf >>= code_len; num_bits -= code_len;

            pOut_buf_cur[0] = (mz_uint8)counter;
            if (sym2 & 256)
            {
              pOut_buf_cur++;
              counter = sym2;
              break;
            }
            pOut_buf_cur[1] = (mz_uint8)sym2;
            pOut_buf_cur += 2;
          }
        }
        if ((counter &= 511) == 256) break;

        num_extra = s_length_extra[counter - 257]; counter = s_length_base[counter - 257];
        if (num_extra) { mz_uint extra_bits; TINFL_GET_BITS(25, extra_bits, num_extra); counter += extra_bits; }

        TINFL_HUFF_DECODE(26, dist, &r->m_tables[1]);
        num_extra = s_dist_extra[dist]; dist = s_dist_base[dist];
        if (num_extra) { mz_uint extra_bits; TINFL_GET_BITS(27, extra_bits, num_extra); dist += extra_bits; }

        dist_from_out_buf_start = pOut_buf_cur - pOut_buf_start;
        if ((dist > dist_from_out_buf_start) && (decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF))
        {
          TINFL_CR_RETURN_FOREVER(37, TINFL_STATUS_FAILED);
        }

        pSrc = pOut_buf_start + ((dist_from_out_buf_start - dist) & out_buf_size_mask);

        if ((MZ_MAX(pOut_buf_cur, pSrc) + counter) > pOut_buf_end)
        {
          while (counter--)
          {
            while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(53, TINFL_STATUS_HAS_MORE_OUTPUT); }
            *pOut_buf_cur++ = pOut_buf_start[(dist_from_out_buf_start++ - dist) & out_buf_size_mask];
          }
          continue;
        }
#if MINIZ_USE_UNALIGNED_LOADS_AND_STORES
        else if ((counter >= 9) && (counter <= dist))
        {
          const mz_uint8 *pSrc_end = pSrc + (counter & ~7);
          do
          {
            ((mz_uint32 *)pOut_buf_cur)[0] = ((const mz_uint32 *)pSrc)[0];
            ((mz_uint32 *)pOut_buf_cur)[1] = ((const mz_uint32 *)pSrc)[1];
            pOut_buf_cur += 8;
          } while ((pSrc += 8) < pSrc_end);
          if ((counter &= 7) < 3)
          {
            if (counter)
            {
              pOut_buf_cur[0] = pSrc[0];
              if (counter > 1)
                pOut_buf_cur[1] = pSrc[1];
              pOut_buf_cur += counter;
            }
            continue;
          }
        }
#endif
        do
        {
          pOut_buf_cur[0] = pSrc[0];
          pOut_buf_cur[1] = pSrc[1];
          pOut_buf_cur[2] = pSrc[2];
          pOut_buf_cur += 3; pSrc += 3;
        } while ((int)(counter -= 3) > 2);
        if ((int)counter > 0)
        {
          pOut_buf_cur[0] = pSrc[0];
          if ((int)counter > 1)
            pOut_buf_cur[1] = pSrc[1];
          pOut_buf_cur += counter;
        }
      }
    }
  } while (!(r->m_final & 1));
  if (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER)
  {
    TINFL_SKIP_BITS(32, num_bits & 7); for (counter = 0; counter < 4; ++counter) { mz_uint s; if (num_bits) TINFL_GET_BITS(41, s, 8); else TINFL_GET_BYTE(42, s); r->m_z_adler32 = (r->m_z_adler32 << 8) | s; }
  }
  TINFL_CR_RETURN_FOREVER(34, TINFL_STATUS_DONE);
  TINFL_CR_FINISH

common_exit:
  r->m_num_bits = num_bits; r->m_bit_buf = bit_buf; r->m_dist = dist; r->m_counter = counter; r->m_num_extra = num_extra; r->m_dist_from_out_buf_start = dist_from_out_buf_start;
  *pIn_buf_size = pIn_buf_cur - pIn_buf_next; *pOut_buf_size = pOut_buf_cur - pOut_buf_next;
  //if ((decomp_flags & (TINFL_FLAG_PARSE_ZLIB_HEADER | TINFL_FLAG_COMPUTE_ADLER32)) && (status >= 0))
  if ((decomp_flags & TINFL_FLAG_COMPUTE_ADLER32) && (status >= 0))
  {
    const mz_uint8 *ptr = pOut_buf_next; size_t buf_len = *pOut_buf_size;
    mz_uint32 i, s1 = r->m_check_adler32 & 0xffff, s2 = r->m_check_adler32 >> 16; size_t block_len = buf_len % 5552;
    while (buf_len)
    {
      for (i = 0; i + 7 < block_len; i += 8, ptr += 8)
      {
        s1 += ptr[0], s2 += s1; s1 += ptr[1], s2 += s1; s1 += ptr[2], s2 += s1; s1 += ptr[3], s2 += s1;
        s1 += ptr[4], s2 += s1; s1 += ptr[5], s2 += s1; s1 += ptr[6], s2 += s1; s1 += ptr[7], s2 += s1;
      }
      for ( ; i < block_len; ++i) s1 += *ptr++, s2 += s1;
      s1 %= 65521U, s2 %= 65521U; buf_len -= block_len; block_len = 5552;
    }
    r->m_check_adler32 = (s2 << 16) + s1; 
    if ((status == TINFL_STATUS_DONE) && (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER) && (r->m_check_adler32 != r->m_z_adler32)) 
        status = TINFL_STATUS_ADLER32_MISMATCH;
  }
  return status;
}